

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_4,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_2> *in_RCX;
  ulong uVar2;
  Vector<float,_3> res;
  Type in1;
  float afStack_88 [6];
  float local_70 [6];
  undefined8 local_58;
  undefined4 local_50;
  MatrixCaseUtils local_48 [16];
  undefined1 local_38 [16];
  undefined4 local_28;
  undefined8 local_1c;
  undefined4 local_14;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_48._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    local_48._8_8_ = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    local_48._0_8_ = 0x3e4ccccd3fb33333;
    local_48._8_8_ = 0x3f333333bf000000;
  }
  uVar2 = CONCAT44((int)((uint)(in1Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f,
                   (int)((uint)(in1Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f);
  local_38._0_8_ = ~uVar2 & DAT_00ae38e0 | *(ulong *)(evalCtx->coords).m_data & uVar2;
  outerProduct<float,2,4>
            ((Matrix<float,_4,_2> *)(local_38 + 8),local_48,(Vector<float,_4> *)local_38,in_RCX);
  local_70[0] = (float)local_38._8_4_;
  local_70[1] = (float)local_38._12_4_;
  local_70[2] = (float)local_28;
  local_58 = local_1c;
  local_50 = local_14;
  afStack_88[2] = 0.0;
  afStack_88[3] = 0.0;
  afStack_88[4] = 0.0;
  lVar1 = 0;
  do {
    afStack_88[lVar1 + 2] = local_70[lVar1] + *(float *)((long)&local_58 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_70[2] = 0.0;
  local_70[3] = 1.4013e-45;
  local_70[4] = 2.8026e-45;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[(int)local_70[lVar1]] = afStack_88[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}